

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::getSubroutineIndex
          (FunctionalTest3_4 *this,GLuint program_id,GLchar *subroutine_name,bool use_program_query)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  GLuint local_34;
  GLuint index;
  Functions *gl;
  bool use_program_query_local;
  GLchar *subroutine_name_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (use_program_query) {
    local_34 = (**(code **)(lVar4 + 0x9a8))(program_id,0x92e8,subroutine_name);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"GetProgramResourceIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xc9d);
  }
  else {
    local_34 = (**(code **)(lVar4 + 0xa88))(program_id,0x8b31,subroutine_name);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"GetSubroutineIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xc98);
  }
  if (local_34 == 0xffffffff) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Subroutine is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0xca2);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_34;
}

Assistant:

GLuint FunctionalTest3_4::getSubroutineIndex(GLuint program_id, const glw::GLchar* subroutine_name,
											 bool use_program_query) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = -1;

	if (false == use_program_query)
	{
		index = gl.getSubroutineIndex(program_id, GL_VERTEX_SHADER, subroutine_name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetSubroutineIndex");
	}
	else
	{
		index = gl.getProgramResourceIndex(program_id, GL_VERTEX_SUBROUTINE, subroutine_name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramResourceIndex");
	}

	if (GL_INVALID_INDEX == index)
	{
		TCU_FAIL("Subroutine is not available");
	}

	return index;
}